

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hpp
# Opt level: O0

void __thiscall FunctionSymbol::~FunctionSymbol(FunctionSymbol *this)

{
  Symbol *in_RDI;
  
  in_RDI->_vptr_Symbol = (_func_int **)&PTR__FunctionSymbol_002b1188;
  std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::~list
            ((list<TypeName,_std::allocator<TypeName>_> *)0x17ef6a);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  Symbol::~Symbol(in_RDI);
  return;
}

Assistant:

FunctionSymbol(const std::string& name, const TypeName& returnType, 
    const std::list<TypeName>& arguments):
      name_(name), returnType_(returnType), arguments_(arguments) {}